

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

bool QApplicationPrivate::translateRawTouchEvent(QWidget *window,QTouchEvent *te)

{
  uint *puVar1;
  uchar uVar2;
  QEventPointPrivate *pQVar3;
  undefined1 auVar4 [16];
  undefined2 uVar5;
  char cVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  undefined4 uVar12;
  QApplicationPrivate *device;
  iterator touchPoint_00;
  iterator iVar13;
  QPoint QVar14;
  int *piVar15;
  ulong uVar16;
  int *piVar17;
  int *piVar18;
  QPoint child;
  undefined4 uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  QPoint arg;
  QApplicationPrivate *this;
  QWidget *pQVar23;
  QPoint this_00;
  Data *pDVar24;
  QEventPoint *touchPoint;
  long in_FS_OFFSET;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double in_XMM1_Qa;
  undefined1 auVar28 [16];
  QWidget *targetWidget;
  QMutableTouchEvent touchEvent;
  QPoint QVar29;
  QWidget *this_01;
  QPoint local_b0;
  QArrayDataPointer<QEventPoint> local_a8;
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> local_90;
  undefined1 local_88 [24];
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QWidget *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.d = (Data *)0x0;
  device = (QApplicationPrivate *)QPointerEvent::pointingDevice();
  local_a8.d = *(Data **)(te + 0x28);
  local_a8.ptr = *(QEventPoint **)(te + 0x30);
  uVar21 = *(ulong *)(te + 0x38);
  if (local_a8.d != (Data *)0x0) {
    LOCK();
    ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.size = uVar21;
  touchPoint_00 = QList<QEventPoint>::begin((QList<QEventPoint> *)&local_a8);
  iVar13 = QList<QEventPoint>::end((QList<QEventPoint> *)&local_a8);
  for (; touchPoint_00.i != iVar13.i; touchPoint_00.i = touchPoint_00.i + 1) {
    cVar6 = QEventPoint::state();
    if (cVar6 == '\x01') {
      iVar11 = QInputDevice::type();
      if (iVar11 == 4) {
        QVar14 = (QPoint)QPointingDevicePrivate::firstActiveTarget();
        if (QVar14 == (QPoint)0x0) goto LAB_002c1253;
        piVar15 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar14);
      }
      else {
        QVar14.xp.m_i = 0;
        QVar14.yp.m_i = 0;
LAB_002c1253:
        piVar15 = (int *)0x0;
      }
      uVar19 = (undefined4)uVar21;
      if (((piVar15 == (int *)0x0) || (QVar14 == (QPoint)0x0)) ||
         (piVar18 = piVar15, QVar29 = (QPoint)window, piVar15[1] == 0)) {
        if ((QPoint)window == (QPoint)0x0) {
          dVar25 = (double)QEventPoint::globalPosition();
          auVar26._0_8_ =
               (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
          auVar26._8_8_ = (double)((ulong)dVar25 & 0x8000000000000000 | 0x3fe0000000000000) + dVar25
          ;
          auVar26 = minpd(_DAT_0066f5d0,auVar26);
          in_XMM1_Qa = (double)-(ulong)(-2147483648.0 < auVar26._0_8_);
          auVar27._8_8_ = -(ulong)(-2147483648.0 < auVar26._8_8_);
          auVar27._0_8_ = in_XMM1_Qa;
          uVar20 = movmskpd(uVar19,auVar27);
          if ((uVar20 & 1) == 0) {
            uVar16 = 0x8000000000000000;
          }
          else {
            uVar16 = (ulong)(uint)(int)auVar26._0_8_ << 0x20;
          }
          if ((uVar20 & 2) == 0) {
            uVar21 = 0x80000000;
          }
          else {
            uVar21 = (ulong)(uint)(int)auVar26._8_8_;
          }
          local_88._0_8_ = uVar16 | uVar21;
          window = QApplication::topLevelAt((QPoint *)local_88);
        }
        uVar19 = (undefined4)uVar21;
        if ((QPoint)window == (QPoint)0x0) {
          QVar29.xp.m_i = 0;
          QVar29.yp.m_i = 0;
          goto LAB_002c157a;
        }
        dVar25 = (double)QEventPoint::globalPosition();
        auVar28._0_8_ =
             (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
        auVar28._8_8_ = (double)((ulong)dVar25 & 0x8000000000000000 | 0x3fe0000000000000) + dVar25;
        auVar27 = minpd(_DAT_0066f5d0,auVar28);
        in_XMM1_Qa = (double)-(ulong)(-2147483648.0 < auVar27._0_8_);
        auVar4._8_8_ = -(ulong)(-2147483648.0 < auVar27._8_8_);
        auVar4._0_8_ = in_XMM1_Qa;
        uVar20 = movmskpd(uVar19,auVar4);
        if ((uVar20 & 1) == 0) {
          uVar21 = 0x8000000000000000;
        }
        else {
          uVar21 = (ulong)(uint)(int)auVar27._0_8_ << 0x20;
        }
        if ((uVar20 & 2) == 0) {
          uVar16 = 0x80000000;
        }
        else {
          uVar16 = (ulong)(uint)(int)auVar27._8_8_;
        }
        local_b0 = (QPoint)(uVar21 | uVar16);
        local_88._0_8_ = QWidget::mapFromGlobal(window,&local_b0);
        QVar14 = (QPoint)QWidget::childAt(window,(QPoint *)local_88);
        if (QVar14 == (QPoint)0x0) {
          piVar17 = (int *)0x0;
        }
        else {
          piVar17 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)QVar14);
        }
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            operator_delete(piVar15);
          }
        }
        QVar29 = (QPoint)window;
        if ((((piVar17 == (int *)0x0) || (QVar14 == (QPoint)0x0)) ||
            (piVar18 = piVar17, piVar17[1] == 0)) &&
           (piVar18 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef
                                       (&window->super_QObject), QVar14 = (QPoint)window,
           piVar17 != (int *)0x0)) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            operator_delete(piVar17);
          }
        }
      }
      this = device;
      iVar11 = QInputDevice::type();
      piVar15 = piVar18;
      if (iVar11 == 2) {
        child = (QPoint)findClosestTouchPointTarget(this,(QPointingDevice *)device,touchPoint_00.i);
        if ((piVar18 == (int *)0x0) || (this_00 = QVar14, piVar18[1] == 0)) {
          this_00.xp.m_i = 0;
          this_00.yp.m_i = 0;
        }
        if ((child == (QPoint)0x0) ||
           ((bVar7 = QWidget::isAncestorOf((QWidget *)this_00,(QWidget *)child), !bVar7 &&
            (bVar7 = QWidget::isAncestorOf((QWidget *)child,(QWidget *)this_00), !bVar7)))) {
          bVar7 = false;
          child = QVar14;
        }
        else {
          piVar15 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)child);
          bVar7 = true;
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              operator_delete(piVar18);
            }
          }
        }
      }
      else {
        bVar7 = false;
        child = QVar14;
      }
      iVar11 = QInputDevice::type();
      if ((bVar7) || (iVar11 == 4)) {
        if ((piVar15 == (int *)0x0) || (arg = child, piVar15[1] == 0)) {
          arg.xp.m_i = 0;
          arg.yp.m_i = 0;
        }
        QMutableEventPoint::setTarget(touchPoint_00.i,(QObject *)arg);
      }
LAB_002c14ee:
      if ((piVar15 == (int *)0x0) || (piVar15[1] == 0)) {
        child.xp.m_i = 0;
        child.yp.m_i = 0;
      }
      local_b0 = child;
      QHash<QWidget*,std::pair<QEventPoint::State,QList<QEventPoint>>>::
      tryEmplace_impl<QWidget*const&>((TryEmplaceResult *)local_88,&local_90,(QWidget **)&local_b0);
      lVar22 = ((ulong)local_88._8_8_ >> 7) * 0x90;
      uVar16 = (ulong)*(byte *)((ulong)((uint)local_88._8_8_ & 0x7f) +
                               *(long *)(local_88._0_8_ + 0x20) + lVar22);
      uVar21 = uVar16 * 5;
      lVar22 = *(long *)(*(long *)(local_88._0_8_ + 0x20) + 0x80 + lVar22) + uVar16 * 0x28;
      bVar10 = *(byte *)(lVar22 + 8);
      bVar8 = QEventPoint::state();
      *(byte *)(lVar22 + 8) = bVar8 | bVar10;
      QtPrivate::QMovableArrayOps<QEventPoint>::emplace<QEventPoint_const&>
                ((QMovableArrayOps<QEventPoint> *)(lVar22 + 0x10),*(qsizetype *)(lVar22 + 0x20),
                 touchPoint_00.i);
      QList<QEventPoint>::end((QList<QEventPoint> *)(lVar22 + 0x10));
    }
    else {
      pQVar3 = ((touchPoint_00.i)->d).d.ptr;
      uVar21 = *(ulong *)(pQVar3 + 0x20);
      if ((uVar21 == 0) || (puVar1 = (uint *)(uVar21 + 4), uVar21 = (ulong)*puVar1, *puVar1 == 0)) {
        child.xp.m_i = 0;
        child.yp.m_i = 0;
      }
      else {
        child = *(QPoint *)(pQVar3 + 0x28);
      }
      if (child == (QPoint)0x0) {
        piVar15 = (int *)0x0;
        QVar29 = (QPoint)window;
      }
      else {
        piVar15 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)child);
        QVar29 = (QPoint)window;
      }
      if (((piVar15 != (int *)0x0) && (child != (QPoint)0x0)) && (piVar15[1] != 0))
      goto LAB_002c14ee;
    }
LAB_002c157a:
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        operator_delete(piVar15);
      }
    }
    window = (QWidget *)QVar29;
  }
  if ((local_90.d != (Data *)0x0) && ((local_90.d)->size != 0)) {
    if (local_90.d == (Data *)0x0) {
      pDVar24 = (Data *)0x0;
LAB_002c1601:
      uVar21 = 0;
    }
    else {
      pDVar24 = local_90.d;
      if ((local_90.d)->spans->offsets[0] != 0xff) goto LAB_002c1601;
      uVar16 = 1;
      do {
        uVar21 = uVar16;
        if ((local_90.d)->numBuckets == uVar21) {
          pDVar24 = (Data *)0x0;
          uVar21 = 0;
          break;
        }
        uVar16 = uVar21 + 1;
      } while ((local_90.d)->spans[uVar21 >> 7].offsets[(uint)uVar21 & 0x7f] == 0xff);
    }
    if (pDVar24 != (Data *)0x0 || uVar21 != 0) {
      bVar7 = false;
      do {
        uVar16 = uVar21 >> 7;
        uVar20 = (uint)uVar21 & 0x7f;
        this_01 = *(QWidget **)
                   pDVar24->spans[uVar16].entries[pDVar24->spans[uVar16].offsets[uVar20]].storage.
                   data;
        if (this_01 == (QWidget *)0x0) {
          piVar15 = (int *)0x0;
        }
        else {
          piVar15 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&this_01->super_QObject)
          ;
        }
        if (piVar15 == (int *)0x0) {
          pQVar23 = (QWidget *)0x0;
        }
        else {
          pQVar23 = this_01;
          if (piVar15[1] == 0) {
            pQVar23 = (QWidget *)0x0;
          }
        }
        bVar9 = tryModalHelper(pQVar23,(QWidget **)0x0);
        if (bVar9) {
          uVar2 = pDVar24->spans[uVar16].entries[pDVar24->spans[uVar16].offsets[uVar20]].storage.
                  data[8];
          if (uVar2 == '\x01') {
            uVar19 = 0xc2;
          }
          else {
            if (uVar2 == '\x04') goto LAB_002c196f;
            if (uVar2 == '\b') {
              uVar19 = 0xc4;
            }
            else {
              uVar19 = 0xc3;
            }
          }
          local_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          uVar12 = QGuiApplication::keyboardModifiers();
          QTouchEvent::QTouchEvent
                    ((QTouchEvent *)local_88,uVar19,device,uVar12,
                     pDVar24->spans[uVar16].entries[pDVar24->spans[uVar16].offsets[uVar20]].storage.
                     data + 0x10);
          local_88._0_8_ = QFontMetrics::leading;
          if (piVar15 == (int *)0x0) {
            pQVar23 = (QWidget *)0x0;
          }
          else {
            pQVar23 = this_01;
            if (piVar15[1] == 0) {
              pQVar23 = (QWidget *)0x0;
            }
          }
          bVar9 = updateTouchPointsForWidget(pQVar23,(QTouchEvent *)local_88);
          QPointerEvent::setTimestamp((ulonglong)local_88);
          if (piVar15 == (int *)0x0) {
            local_48 = (QWidget *)0x0;
          }
          else {
            local_48 = this_01;
            if (piVar15[1] == 0) {
              local_48 = (QWidget *)0x0;
            }
          }
          if (bVar9) {
            QWidget::setAttribute(this_01,WA_WState_AcceptedTouchBeginEvent,true);
          }
          uVar5 = local_88._8_2_;
          if (local_88._8_2_ == 0xc2) {
            if (te[0xb] == (QTouchEvent)0x1) {
              if (piVar15 == (int *)0x0) {
                pQVar23 = (QWidget *)0x0;
              }
              else {
                pQVar23 = this_01;
                if (piVar15[1] == 0) {
                  pQVar23 = (QWidget *)0x0;
                }
              }
              cVar6 = QCoreApplication::sendSpontaneousEvent
                                (&pQVar23->super_QObject,(QEvent *)local_88);
            }
            else {
              if (piVar15 == (int *)0x0) {
                pQVar23 = (QWidget *)0x0;
              }
              else {
                pQVar23 = this_01;
                if (piVar15[1] == 0) {
                  pQVar23 = (QWidget *)0x0;
                }
              }
              cVar6 = QCoreApplication::sendEvent(&pQVar23->super_QObject,(QEvent *)local_88);
            }
            if (cVar6 != '\0') {
              if (local_88[0xc] != '\0') {
                bVar7 = true;
              }
              if (local_88[0xc] == '\x01' && piVar15 != (int *)0x0) {
                iVar11 = piVar15[1];
                bVar7 = true;
LAB_002c193a:
                if ((this_01 != (QWidget *)0x0) && (iVar11 != 0)) {
                  QWidget::setAttribute(this_01,WA_WState_AcceptedTouchBeginEvent,uVar5 == 0xc2);
                }
              }
            }
          }
          else {
            bVar9 = QWidget::testAttribute_helper(this_01,WA_WState_AcceptedTouchBeginEvent);
            if ((bVar9) || (bVar9 = QGestureManager::gesturePending(&this_01->super_QObject), bVar9)
               ) {
              if (te[0xb] == (QTouchEvent)0x1) {
                if (piVar15 == (int *)0x0) {
                  pQVar23 = (QWidget *)0x0;
                }
                else {
                  pQVar23 = this_01;
                  if (piVar15[1] == 0) {
                    pQVar23 = (QWidget *)0x0;
                  }
                }
                bVar10 = QCoreApplication::sendSpontaneousEvent
                                   (&pQVar23->super_QObject,(QEvent *)local_88);
              }
              else {
                if (piVar15 == (int *)0x0) {
                  pQVar23 = (QWidget *)0x0;
                }
                else {
                  pQVar23 = this_01;
                  if (piVar15[1] == 0) {
                    pQVar23 = (QWidget *)0x0;
                  }
                }
                bVar10 = QCoreApplication::sendEvent(&pQVar23->super_QObject,(QEvent *)local_88);
              }
              if ((local_88[0xc] & bVar10) != 0) {
                bVar7 = true;
              }
              if (local_88._8_2_ == 0xc4) {
                iVar11 = piVar15[1];
                goto LAB_002c193a;
              }
            }
          }
          QMutableTouchEvent::~QMutableTouchEvent((QMutableTouchEvent *)local_88);
        }
LAB_002c196f:
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            operator_delete(piVar15);
          }
        }
        do {
          if (pDVar24->numBuckets - 1 == uVar21) {
            pDVar24 = (Data *)0x0;
            uVar21 = 0;
            break;
          }
          uVar21 = uVar21 + 1;
        } while (pDVar24->spans[uVar21 >> 7].offsets[(uint)uVar21 & 0x7f] == 0xff);
      } while ((pDVar24 != (Data *)0x0) || (uVar21 != 0));
      goto LAB_002c19d3;
    }
  }
  bVar7 = false;
LAB_002c19d3:
  QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&local_a8);
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::~QHash(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QApplicationPrivate::translateRawTouchEvent(QWidget *window, const QTouchEvent *te)
{
    QApplicationPrivate *d = self;
    // TODO get rid of this std::pair
    typedef std::pair<QEventPoint::State, QList<QEventPoint> > StatesAndTouchPoints;
    QHash<QWidget *, StatesAndTouchPoints> widgetsNeedingEvents;

    const auto *device = te->pointingDevice();
    auto touchPoints = te->points(); // touch points will be mutated
    for (auto &touchPoint : touchPoints) {
        // update state
        QPointer<QObject> target;
        if (touchPoint.state() == QEventPoint::State::Pressed) {
            if (device->type() == QInputDevice::DeviceType::TouchPad) {
                // on touchpads, send all touch points to the same widget:
                // pick the first non-null target if possible
                target = QPointingDevicePrivate::get(device)->firstActiveTarget();
            }

            if (target.isNull()) {
                // determine which widget this event will go to
                if (!window)
                    window = QApplication::topLevelAt(touchPoint.globalPosition().toPoint());
                if (!window)
                    continue;
                target = window->childAt(window->mapFromGlobal(touchPoint.globalPosition().toPoint()));
                if (!target)
                    target = window;
            }

            bool usingClosestWidget = false;
            if (device->type() == QInputDevice::DeviceType::TouchScreen) {
                QWidget *closestWidget = d->findClosestTouchPointTarget(device, touchPoint);
                QWidget *widget = static_cast<QWidget *>(target.data());
                if (closestWidget
                        && (widget->isAncestorOf(closestWidget) || closestWidget->isAncestorOf(widget))) {
                    target = closestWidget;
                    usingClosestWidget = true;
                }
            }

            // on touch pads, implicitly grab all touch points
            // on touch screens, grab touch points that are redirected to the closest widget
            if (device->type() == QInputDevice::DeviceType::TouchPad || usingClosestWidget)
                QMutableEventPoint::setTarget(touchPoint, target);
        } else {
            target = QMutableEventPoint::target(touchPoint);
            if (!target)
                continue;
        }
        Q_ASSERT(!target.isNull());

        QWidget *targetWidget = static_cast<QWidget *>(target.data());

#ifdef Q_OS_MACOS
        // Single-touch events are normally not sent unless WA_TouchPadAcceptSingleTouchEvents is set.
        // In Qt 4 this check was in OS X-only code. That behavior is preserved here by the #ifdef.
        if (touchPoints.count() == 1
            && device->type() == QInputDevice::DeviceType::TouchPad
            && !targetWidget->testAttribute(Qt::WA_TouchPadAcceptSingleTouchEvents))
            continue;
#endif

        StatesAndTouchPoints &maskAndPoints = widgetsNeedingEvents[targetWidget];
        maskAndPoints.first = QEventPoint::State(maskAndPoints.first | touchPoint.state());
        maskAndPoints.second.append(touchPoint);
    }

    if (widgetsNeedingEvents.isEmpty())
        return false;

    bool accepted = false;
    QHash<QWidget *, StatesAndTouchPoints>::ConstIterator it = widgetsNeedingEvents.constBegin();
    const QHash<QWidget *, StatesAndTouchPoints>::ConstIterator end = widgetsNeedingEvents.constEnd();
    for (; it != end; ++it) {
        const QPointer<QWidget> widget = it.key();
        if (!QApplicationPrivate::tryModalHelper(widget, nullptr))
            continue;

        QEvent::Type eventType;
        switch (it.value().first) {
        case QEventPoint::State::Pressed:
            eventType = QEvent::TouchBegin;
            break;
        case QEventPoint::State::Released:
            eventType = QEvent::TouchEnd;
            break;
        case QEventPoint::State::Stationary:
            // don't send the event if nothing changed
            continue;
        default:
            eventType = QEvent::TouchUpdate;
            break;
        }

        QMutableTouchEvent touchEvent(eventType, device, QGuiApplication::keyboardModifiers(),
                                      it.value().second);
        bool containsPress = updateTouchPointsForWidget(widget, &touchEvent);
        touchEvent.setTimestamp(te->timestamp());
        touchEvent.setTarget(widget);

        if (containsPress)
            widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent);

        switch (touchEvent.type()) {
        case QEvent::TouchBegin:
        {
            // if the TouchBegin handler recurses, we assume that means the event
            // has been implicitly accepted and continue to send touch events
            bool res = te->spontaneous() ? QApplication::sendSpontaneousEvent(widget, &touchEvent)
                                         : QApplication::sendEvent(widget, &touchEvent);
            if (res && touchEvent.isAccepted()) {
                accepted = true;
                if (!widget.isNull())
                    widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent);
            }
            break;
        }
        default:
            if (widget->testAttribute(Qt::WA_WState_AcceptedTouchBeginEvent)
#ifndef QT_NO_GESTURES
                || QGestureManager::gesturePending(widget)
#endif
                ) {
                bool res = te->spontaneous() ? QApplication::sendSpontaneousEvent(widget, &touchEvent)
                                            : QApplication::sendEvent(widget, &touchEvent);
                if (res && touchEvent.isAccepted())
                    accepted = true;
                // widget can be deleted on TouchEnd
                if (touchEvent.type() == QEvent::TouchEnd && !widget.isNull())
                    widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent, false);
            }
            break;
        }
    }
    return accepted;
}